

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectionElement,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcProjectionElement *in;
  
  in = (IfcProjectionElement *)operator_new(0x180);
  *(undefined ***)&(in->super_IfcFeatureElementAddition).field_0x168 = &PTR__Object_00806a70;
  *(undefined8 *)&in->field_0x170 = 0;
  *(char **)&in->field_0x178 = "IfcProjectionElement";
  Assimp::IFC::Schema_2x3::IfcFeatureElementAddition::IfcFeatureElementAddition
            ((IfcFeatureElementAddition *)in,&PTR_construction_vtable_24__008aea88);
  *(undefined ***)
   &(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.super_IfcProduct.
    super_IfcObject = &PTR__IfcProjectionElement_008ae930;
  *(undefined ***)&(in->super_IfcFeatureElementAddition).field_0x168 =
       &PTR__IfcProjectionElement_008aea70;
  *(undefined ***)
   &(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0x88 = &PTR__IfcProjectionElement_008ae958;
  (in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.super_IfcProduct.
  super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcProjectionElement_008ae980;
  *(undefined ***)
   &(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0xd0 = &PTR__IfcProjectionElement_008ae9a8;
  *(undefined ***)
   &(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.super_IfcProduct.
    field_0x100 = &PTR__IfcProjectionElement_008ae9d0;
  *(undefined ***)
   &(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.field_0x138 =
       &PTR__IfcProjectionElement_008ae9f8;
  *(undefined ***)
   &(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.field_0x148 =
       &PTR__IfcProjectionElement_008aea20;
  *(undefined ***)&(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.field_0x158 =
       &PTR__IfcProjectionElement_008aea48;
  GenericFill<Assimp::IFC::Schema_2x3::IfcProjectionElement>(db,params,in);
  return (Object *)
         (&(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.super_IfcElement.
           super_IfcProduct.super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcFeatureElementAddition).super_IfcFeatureElement.
                             super_IfcElement.super_IfcProduct.super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }